

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

bool __thiscall Map_Tile::Walkable(Map_Tile *this,bool npc)

{
  TileSpec TVar1;
  bool bVar2;
  bool npc_local;
  Map_Tile *this_local;
  
  bVar2 = Map_Warp::operator_cast_to_bool(&this->warp);
  if ((bVar2) && (npc)) {
    return false;
  }
  TVar1 = this->tilespec;
  if (((7 < (uint)TVar1) && (TVar1 != Chest)) && (TVar1 != BankVault)) {
    if (TVar1 == NPCBoundary) {
      return (bool)((npc ^ 0xffU) & 1);
    }
    if ((TVar1 != MapEdge) && (8 < (uint)(TVar1 + ~FakeWall))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Walkable(bool npc = false) const
	{
		if (this->warp && npc)
		{
			return false;
		}

		switch (this->tilespec)
		{
			case Wall:
			case ChairDown:
			case ChairLeft:
			case ChairRight:
			case ChairUp:
			case ChairDownRight:
			case ChairUpLeft:
			case ChairAll:
			case Chest:
			case BankVault:
			case MapEdge:
			case Board1:
			case Board2:
			case Board3:
			case Board4:
			case Board5:
			case Board6:
			case Board7:
			case Board8:
			case Jukebox:
				return false;
			case NPCBoundary:
				return !npc;
			default:
				return true;
		}
	}